

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

int32_t mm_accumulate_epi16(__m128i vec_a)

{
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  __m128i vtmp;
  __m128i vec_a_local;
  undefined2 local_18;
  undefined2 uStack_16;
  undefined2 uStack_14;
  undefined2 uStack_12;
  undefined2 uStack_10;
  undefined2 uStack_e;
  undefined2 uStack_c;
  undefined2 uStack_a;
  
  local_18 = (short)in_XMM0_Qa;
  uStack_16 = (short)((ulong)in_XMM0_Qa >> 0x10);
  uStack_14 = (short)((ulong)in_XMM0_Qa >> 0x20);
  uStack_12 = (short)((ulong)in_XMM0_Qa >> 0x30);
  uStack_10 = (short)in_XMM0_Qb;
  uStack_e = (short)((ulong)in_XMM0_Qb >> 0x10);
  uStack_c = (short)((ulong)in_XMM0_Qb >> 0x20);
  uStack_a = (short)((ulong)in_XMM0_Qb >> 0x30);
  return (uint)(ushort)(local_18 + uStack_10 + uStack_14 + uStack_c +
                       uStack_16 + uStack_e + uStack_12 + uStack_a);
}

Assistant:

static inline int32_t mm_accumulate_epi16(__m128i vec_a) {
  __m128i vtmp = _mm_srli_si128(vec_a, 8);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  vtmp = _mm_srli_si128(vec_a, 4);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  vtmp = _mm_srli_si128(vec_a, 2);
  vec_a = _mm_add_epi16(vec_a, vtmp);
  return _mm_extract_epi16(vec_a, 0);
}